

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_6b4295::AnyOutputMatches
          (anon_unknown_dwarf_6b4295 *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  long lVar4;
  anon_unknown_dwarf_6b4295 *local_38;
  
  lVar4 = (long)outputs - (long)name;
  local_38 = this;
  if (0 < lVar4 >> 7) {
    lVar2 = (lVar4 >> 7) + 1;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_38,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )name);
      _Var3._M_current = name;
      if (bVar1) goto LAB_00275792;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_38,name + 1);
      _Var3._M_current = name + 1;
      if (bVar1) goto LAB_00275792;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_38,name + 2);
      _Var3._M_current = name + 2;
      if (bVar1) goto LAB_00275792;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_38,name + 3);
      _Var3._M_current = name + 3;
      if (bVar1) goto LAB_00275792;
      name = name + 4;
      lVar2 = lVar2 + -1;
      lVar4 = lVar4 + -0x80;
    } while (1 < lVar2);
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var3._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)outputs;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                *)&local_38,
                               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )name), _Var3._M_current = name, bVar1)) goto LAB_00275792;
      name = name + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)&local_38,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )name);
    _Var3._M_current = name;
    if (bVar1) goto LAB_00275792;
    name = name + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
          ::operator()((_Iter_pred<(anonymous_namespace)::AnyOutputMatches(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                        *)&local_38,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )name);
  _Var3._M_current = name;
  if (!bVar1) {
    _Var3._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)outputs;
  }
LAB_00275792:
  return _Var3._M_current !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)outputs;
}

Assistant:

bool AnyOutputMatches(const std::string& name,
                      const std::vector<std::string>& outputs)
{
  return std::any_of(outputs.begin(), outputs.end(),
                     [&name](std::string const& output) -> bool {
                       std::string::size_type pos = output.rfind(name);
                       // If the output matches exactly
                       return (pos != std::string::npos &&
                               pos == output.size() - name.size() &&
                               (pos == 0 || output[pos - 1] == '/'));
                     });
}